

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cParallelShaderCompileTests.cpp
# Opt level: O0

IterateResult __thiscall
gl4cts::CompilationCompletionNonParallelTest::iterate(CompilationCompletionNonParallelTest *this)

{
  glCompileShaderFunc p_Var1;
  glGetShaderivFunc p_Var2;
  glLinkProgramFunc p_Var3;
  glGetProgramivFunc p_Var4;
  bool bVar5;
  int iVar6;
  GLenum GVar7;
  deUint32 dVar8;
  ContextInfo *this_00;
  RenderContext *pRVar9;
  undefined4 extraout_var;
  size_t sVar10;
  int local_164;
  char *pcStack_160;
  int fLengths [1];
  char *fSources [1];
  char *pcStack_150;
  int vLengths [1];
  char *vSources [1];
  Shader fragmentShader;
  undefined1 local_d0 [8];
  Shader vertexShader;
  Program program;
  GLint completionStatus;
  Functions *gl;
  CompilationCompletionNonParallelTest *this_local;
  Functions *gl_00;
  
  this_00 = deqp::Context::getContextInfo((this->super_TestCase).m_context);
  bVar5 = glu::ContextInfo::isExtensionSupported(this_00,"GL_ARB_parallel_shader_compile");
  if (bVar5) {
    pRVar9 = deqp::Context::getRenderContext((this->super_TestCase).m_context);
    iVar6 = (*pRVar9->_vptr_RenderContext[3])();
    gl_00 = (Functions *)CONCAT44(extraout_var,iVar6);
    (*gl_00->maxShaderCompilerThreadsARB)(0);
    GVar7 = (*gl_00->getError)();
    glu::checkError(GVar7,"maxShaderCompilerThreadsARB",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cParallelShaderCompileTests.cpp"
                    ,0xd6);
    glu::Program::Program((Program *)&vertexShader.m_info.compileTimeUs,gl_00);
    glu::Shader::Shader((Shader *)local_d0,gl_00,SHADERTYPE_VERTEX);
    glu::Shader::Shader((Shader *)vSources,gl_00,SHADERTYPE_FRAGMENT);
    pcStack_150 = vShader;
    sVar10 = strlen(vShader);
    fSources[0]._4_4_ = (undefined4)sVar10;
    glu::Shader::setSources
              ((Shader *)local_d0,1,&stack0xfffffffffffffeb0,(int *)((long)fSources + 4));
    pcStack_160 = fShader;
    sVar10 = strlen(fShader);
    local_164 = (int)sVar10;
    glu::Shader::setSources((Shader *)vSources,1,&stack0xfffffffffffffea0,&local_164);
    p_Var1 = gl_00->compileShader;
    dVar8 = glu::Shader::getShader((Shader *)local_d0);
    (*p_Var1)(dVar8);
    GVar7 = (*gl_00->getError)();
    glu::checkError(GVar7,"compileShader",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cParallelShaderCompileTests.cpp"
                    ,0xe6);
    p_Var1 = gl_00->compileShader;
    dVar8 = glu::Shader::getShader((Shader *)vSources);
    (*p_Var1)(dVar8);
    GVar7 = (*gl_00->getError)();
    glu::checkError(GVar7,"compileShader",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cParallelShaderCompileTests.cpp"
                    ,0xe8);
    p_Var2 = gl_00->getShaderiv;
    dVar8 = glu::Shader::getShader((Shader *)vSources);
    (*p_Var2)(dVar8,0x91b1,(GLint *)((long)&program.m_info.linkTimeUs + 4));
    GVar7 = (*gl_00->getError)();
    glu::checkError(GVar7,"getShaderiv",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cParallelShaderCompileTests.cpp"
                    ,0xeb);
    if (program.m_info.linkTimeUs._4_4_ == 0) {
      tcu::TestContext::setTestResult
                ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,QP_TEST_RESULT_FAIL,
                 "Failed reading completion status for non parallel shader compiling");
      this_local._4_4_ = STOP;
      bVar5 = true;
    }
    else {
      dVar8 = glu::Shader::getShader((Shader *)local_d0);
      glu::Program::attachShader((Program *)&vertexShader.m_info.compileTimeUs,dVar8);
      dVar8 = glu::Shader::getShader((Shader *)vSources);
      glu::Program::attachShader((Program *)&vertexShader.m_info.compileTimeUs,dVar8);
      p_Var3 = gl_00->linkProgram;
      dVar8 = glu::Program::getProgram((Program *)&vertexShader.m_info.compileTimeUs);
      (*p_Var3)(dVar8);
      p_Var4 = gl_00->getProgramiv;
      dVar8 = glu::Program::getProgram((Program *)&vertexShader.m_info.compileTimeUs);
      (*p_Var4)(dVar8,0x91b1,(GLint *)((long)&program.m_info.linkTimeUs + 4));
      GVar7 = (*gl_00->getError)();
      glu::checkError(GVar7,"getProgramiv",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cParallelShaderCompileTests.cpp"
                      ,0xf8);
      if (program.m_info.linkTimeUs._4_4_ == 0) {
        tcu::TestContext::setTestResult
                  ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,
                   QP_TEST_RESULT_FAIL,
                   "Failed reading completion status for non parallel program linking");
        this_local._4_4_ = STOP;
        bVar5 = true;
      }
      else {
        bVar5 = false;
      }
    }
    glu::Shader::~Shader((Shader *)vSources);
    glu::Shader::~Shader((Shader *)local_d0);
    glu::Program::~Program((Program *)&vertexShader.m_info.compileTimeUs);
    if (!bVar5) {
      tcu::TestContext::setTestResult
                ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,QP_TEST_RESULT_PASS,
                 "Pass");
      this_local._4_4_ = STOP;
    }
  }
  else {
    tcu::TestContext::setTestResult
              ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,
               QP_TEST_RESULT_NOT_SUPPORTED,"Not supported");
    this_local._4_4_ = STOP;
  }
  return this_local._4_4_;
}

Assistant:

tcu::TestNode::IterateResult CompilationCompletionNonParallelTest::iterate()
{
	if (!m_context.getContextInfo().isExtensionSupported("GL_ARB_parallel_shader_compile"))
	{
		m_testCtx.setTestResult(QP_TEST_RESULT_NOT_SUPPORTED, "Not supported");
		return STOP;
	}

	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	GLint completionStatus;

	gl.maxShaderCompilerThreadsARB(0);
	GLU_EXPECT_NO_ERROR(gl.getError(), "maxShaderCompilerThreadsARB");

	{
		Program program(gl);
		Shader  vertexShader(gl, SHADERTYPE_VERTEX);
		Shader  fragmentShader(gl, SHADERTYPE_FRAGMENT);

		const char* vSources[] = { vShader };
		const int   vLengths[] = { int(strlen(vShader)) };
		vertexShader.setSources(1, vSources, vLengths);

		const char* fSources[] = { fShader };
		const int   fLengths[] = { int(strlen(fShader)) };
		fragmentShader.setSources(1, fSources, fLengths);

		gl.compileShader(vertexShader.getShader());
		GLU_EXPECT_NO_ERROR(gl.getError(), "compileShader");
		gl.compileShader(fragmentShader.getShader());
		GLU_EXPECT_NO_ERROR(gl.getError(), "compileShader");

		gl.getShaderiv(fragmentShader.getShader(), GL_COMPLETION_STATUS_ARB, &completionStatus);
		GLU_EXPECT_NO_ERROR(gl.getError(), "getShaderiv");
		if (!completionStatus)
		{
			m_testCtx.setTestResult(QP_TEST_RESULT_FAIL,
									"Failed reading completion status for non parallel shader compiling");
			return STOP;
		}

		program.attachShader(vertexShader.getShader());
		program.attachShader(fragmentShader.getShader());
		gl.linkProgram(program.getProgram());

		gl.getProgramiv(program.getProgram(), GL_COMPLETION_STATUS_ARB, &completionStatus);
		GLU_EXPECT_NO_ERROR(gl.getError(), "getProgramiv");
		if (!completionStatus)
		{
			m_testCtx.setTestResult(QP_TEST_RESULT_FAIL,
									"Failed reading completion status for non parallel program linking");
			return STOP;
		}
	}

	m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");
	return STOP;
}